

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_tcdb(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGTemp *local_28;
  TCGv_i64 local_20;
  TCGv_i64 local_18;
  
  tcg_ctx = s->uc->tcg_ctx;
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = o->in1 + (long)tcg_ctx;
  local_18 = o->in2 + (long)tcg_ctx;
  tcg_gen_callN_s390x(tcg_ctx,helper_tcdb,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),3,&local_28);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_tcdb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_tcdb(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, o->in1, o->in2);
    set_cc_static(s);
    return DISAS_NEXT;
}